

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::run(void)

{
  value_empty();
  value_false();
  output_false();
  value_true();
  value_null();
  output_null();
  return;
}

Assistant:

void run()
{
    value_empty();
    value_false();
    output_false();
    value_true();
    value_null();
    output_null();
}